

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_quaternion.cpp
# Opt level: O0

bool __thiscall ON_Quaternion::GetRotation(ON_Quaternion *this,ON_Xform *xform)

{
  bool bVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  undefined1 local_40 [8];
  ON_Quaternion q;
  bool rc;
  ON_Xform *xform_local;
  ON_Quaternion *this_local;
  
  local_40 = (undefined1  [8])this->a;
  q.a = this->b;
  q.b = this->c;
  q.c = this->d;
  bVar1 = Unitize((ON_Quaternion *)local_40);
  if (bVar1) {
    if ((((ABS((double)local_40 - this->a) <= 2.3283064365386963e-10) &&
         (ABS(q.a - this->b) <= 2.3283064365386963e-10)) &&
        (ABS(q.b - this->c) <= 2.3283064365386963e-10)) &&
       (ABS(q.c - this->d) <= 2.3283064365386963e-10)) {
      local_40 = (undefined1  [8])this->a;
      q.a = this->b;
      q.b = this->c;
      q.c = this->d;
    }
    dVar3 = (double)local_40 * q.c;
    dVar4 = q.a * q.b;
    pdVar2 = ON_Xform::operator[](xform,1);
    *pdVar2 = (dVar4 + dVar3) * 2.0;
    dVar3 = (double)local_40 * q.b;
    dVar4 = q.a * q.c;
    pdVar2 = ON_Xform::operator[](xform,2);
    *pdVar2 = (dVar4 + -dVar3) * 2.0;
    pdVar2 = ON_Xform::operator[](xform,3);
    *pdVar2 = 0.0;
    dVar3 = (double)local_40 * q.c;
    dVar4 = q.a * q.b;
    pdVar2 = ON_Xform::operator[](xform,0);
    pdVar2[1] = (dVar4 + -dVar3) * 2.0;
    dVar3 = (double)local_40 * q.a;
    dVar4 = q.b * q.c;
    pdVar2 = ON_Xform::operator[](xform,2);
    pdVar2[1] = (dVar4 + dVar3) * 2.0;
    pdVar2 = ON_Xform::operator[](xform,3);
    pdVar2[1] = 0.0;
    dVar3 = (double)local_40 * q.b;
    dVar4 = q.a * q.c;
    pdVar2 = ON_Xform::operator[](xform,0);
    pdVar2[2] = (dVar4 + dVar3) * 2.0;
    dVar3 = (double)local_40 * q.a;
    dVar4 = q.b * q.c;
    pdVar2 = ON_Xform::operator[](xform,1);
    pdVar2[2] = (dVar4 + -dVar3) * 2.0;
    pdVar2 = ON_Xform::operator[](xform,3);
    pdVar2[2] = 0.0;
    q.a = q.a * q.a;
    q.b = q.b * q.b;
    q.c = q.c * q.c;
    dVar3 = q.b + q.c;
    pdVar2 = ON_Xform::operator[](xform,0);
    *pdVar2 = 1.0 - (dVar3 + dVar3);
    dVar3 = q.a + q.c;
    pdVar2 = ON_Xform::operator[](xform,1);
    pdVar2[1] = 1.0 - (dVar3 + dVar3);
    dVar3 = q.a + q.b;
    pdVar2 = ON_Xform::operator[](xform,2);
    pdVar2[2] = 1.0 - (dVar3 + dVar3);
    pdVar2 = ON_Xform::operator[](xform,2);
    pdVar2[3] = 0.0;
    pdVar2 = ON_Xform::operator[](xform,1);
    pdVar2[3] = 0.0;
    pdVar2 = ON_Xform::operator[](xform,0);
    pdVar2[3] = 0.0;
    pdVar2 = ON_Xform::operator[](xform,3);
    pdVar2[3] = 1.0;
    q.d._7_1_ = true;
  }
  else {
    bVar1 = IsZero(this);
    if (bVar1) {
      memcpy(xform,&ON_Xform::Zero4x4,0x80);
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_quaternion.cpp"
                 ,0x125,"","ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
      memcpy(xform,&ON_Xform::IdentityTransformation,0x80);
    }
    q.d._7_1_ = false;
  }
  return q.d._7_1_;
}

Assistant:

bool ON_Quaternion::GetRotation(ON_Xform& xform) const
{
  bool rc;
  ON_Quaternion q(*this);
  if ( q.Unitize() )
  {
    if (    fabs(q.a-a) <= ON_ZERO_TOLERANCE
         && fabs(q.b-b) <= ON_ZERO_TOLERANCE
         && fabs(q.c-c) <= ON_ZERO_TOLERANCE
         && fabs(q.d-d) <= ON_ZERO_TOLERANCE
         )
    {
      // "this" was already unitized - don't tweak bits
      q = *this;
    }
    xform[1][0] = 2.0*(q.b*q.c + q.a*q.d);
    xform[2][0] = 2.0*(q.b*q.d - q.a*q.c);
    xform[3][0] = 0.0;

    xform[0][1] = 2.0*(q.b*q.c - q.a*q.d);
    xform[2][1] = 2.0*(q.c*q.d + q.a*q.b);
    xform[3][1] = 0.0;

    xform[0][2] = 2.0*(q.b*q.d + q.a*q.c);
    xform[1][2] = 2.0*(q.c*q.d - q.a*q.b);
    xform[3][2] = 0.0;

    q.b = q.b*q.b;
    q.c = q.c*q.c;
    q.d = q.d*q.d;
    xform[0][0] = 1.0 - 2.0*(q.c + q.d);
    xform[1][1] = 1.0 - 2.0*(q.b + q.d);
    xform[2][2] = 1.0 - 2.0*(q.b + q.c);

    xform[0][3] = xform[1][3] = xform[2][3] = 0.0;
    xform[3][3] = 1.0;
    rc = true;
  }
  else if ( IsZero() )
  {
    xform = ON_Xform::Zero4x4;
    rc = false;
  }
  else
  {
    // something is seriously wrong
    ON_ERROR("ON_Quaternion::GetRotation(ON_Xform) quaternion is invalid");
    xform = ON_Xform::IdentityTransformation;
    rc = false;
  }

  return rc;
}